

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_graph.c
# Opt level: O1

void canvas_resortoutlets(_glist *x)

{
  t_pd *pp_Var1;
  uint uVar2;
  int iVar3;
  long *fatso;
  _outlet *o;
  t_gobj *ptVar4;
  long *plVar5;
  uint uVar6;
  uint uVar7;
  long *plVar8;
  int x1;
  int y2;
  int x2;
  int y1;
  int local_4c;
  size_t local_48;
  int local_3c;
  int local_38;
  int local_34;
  
  ptVar4 = x->gl_list;
  if (ptVar4 == (t_gobj *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    do {
      pp_Var1 = &ptVar4->g_pd;
      ptVar4 = ptVar4->g_next;
      uVar6 = uVar6 + (*pp_Var1 == voutlet_class);
    } while (ptVar4 != (_gobj *)0x0);
  }
  if (1 < uVar6) {
    local_48 = (ulong)uVar6 << 3;
    fatso = (long *)getbytes(local_48);
    plVar5 = fatso;
    for (ptVar4 = x->gl_list; ptVar4 != (t_gobj *)0x0; ptVar4 = ptVar4->g_next) {
      if (ptVar4->g_pd == voutlet_class) {
        *plVar5 = (long)ptVar4;
        plVar5 = plVar5 + 1;
      }
    }
    uVar2 = uVar6;
    do {
      iVar3 = -0x7fffffff;
      plVar8 = (long *)0x0;
      plVar5 = fatso;
      uVar7 = uVar6;
      do {
        if (((t_gobj *)*plVar5 != (t_gobj *)0x0) &&
           (gobj_getrect((t_gobj *)*plVar5,x,&local_4c,&local_34,&local_38,&local_3c),
           iVar3 < local_4c)) {
          plVar8 = plVar5;
          iVar3 = local_4c;
        }
        uVar7 = uVar7 - 1;
        plVar5 = plVar5 + 1;
      } while (uVar7 != 0);
      if (plVar8 == (long *)0x0) break;
      pp_Var1 = (t_pd *)*plVar8;
      *plVar8 = 0;
      o = voutlet_getit(pp_Var1);
      obj_moveoutletfirst(&x->gl_obj,o);
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
    freebytes(fatso,local_48);
    if (((x->gl_owner != (_glist *)0x0) && ((x->field_0xe9 & 8) == 0)) &&
       (iVar3 = glist_isvisible(x->gl_owner), iVar3 != 0)) {
      canvas_fixlinesfor(x->gl_owner,&x->gl_obj);
    }
  }
  return;
}

Assistant:

void canvas_resortoutlets(t_canvas *x)
{
    int noutlets = 0, i, j, xmax;
    t_gobj *y, **vec, **vp, **maxp;

    for (noutlets = 0, y = x->gl_list; y; y = y->g_next)
        if (pd_class(&y->g_pd) == voutlet_class) noutlets++;

    if (noutlets < 2) return;

    vec = (t_gobj **)getbytes(noutlets * sizeof(*vec));

    for (y = x->gl_list, vp = vec; y; y = y->g_next)
        if (pd_class(&y->g_pd) == voutlet_class) *vp++ = y;

    for (i = noutlets; i--;)
    {
        t_outlet *ip;
        for (vp = vec, xmax = -0x7fffffff, maxp = 0, j = noutlets;
            j--; vp++)
        {
            int x1, y1, x2, y2;
            t_gobj *g = *vp;
            if (!g) continue;
            gobj_getrect(g, x, &x1, &y1, &x2, &y2);
            if (x1 > xmax) xmax = x1, maxp = vp;
        }
        if (!maxp) break;
        y = *maxp;
        *maxp = 0;
        ip = voutlet_getit(&y->g_pd);

        obj_moveoutletfirst(&x->gl_obj, ip);
    }
    freebytes(vec, noutlets * sizeof(*vec));
    if (x->gl_owner && !x->gl_isclone && glist_isvisible(x->gl_owner))
        canvas_fixlinesfor(x->gl_owner, &x->gl_obj);
}